

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::SerializeWithCachedSizes
          (TreeEnsembleClassifier *this,CodedOutputStream *output)

{
  uint32 uVar1;
  
  if (this->treeensemble_ != (TreeEnsembleParameters *)0x0 &&
      this != (TreeEnsembleClassifier *)&_TreeEnsembleClassifier_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->treeensemble_->super_MessageLite,output);
  }
  if (this->postevaluationtransform_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(2,this->postevaluationtransform_,output);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x65) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->has_treeensemble()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->treeensemble_, output);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->postevaluationtransform() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      2, this->postevaluationtransform(), output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleClassifier)
}